

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O2

void __thiscall Rml::DataExpression::~DataExpression(DataExpression *this)

{
  ::std::
  vector<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_std::allocator<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>
  ::~vector(&this->addresses);
  ::std::vector<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>::~vector
            (&this->program);
  ::std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

DataExpression::~DataExpression() {}